

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_5b0ff7::HandleGetRuntimeDependenciesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Base_ptr *__last;
  _Rb_tree_node_base *__x;
  _Base_ptr __x_00;
  cmMakefile *pcVar1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer __position;
  bool bVar2;
  Mode MVar3;
  int iVar4;
  string *psVar5;
  cmState *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar6;
  _Base_ptr p_Var7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  mapped_type *rng;
  _Base_ptr p_Var8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  ostream *poVar10;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  string_view separator;
  string_view value;
  string_view separator_00;
  string_view value_00;
  string_view separator_01;
  string_view value_01;
  string_view separator_02;
  string_view value_02;
  string_view separator_03;
  string_view value_03;
  string pathsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unresolvedDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflictingDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  string platform;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  string local_558;
  Arguments parsedArgs;
  string varName;
  cmRuntimeDependencyArchive archive;
  
  pcVar1 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parsedArgs,"CMAKE_HOST_SYSTEM_NAME",(allocator<char> *)&archive);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsedArgs);
  std::__cxx11::string::string((string *)&platform,(string *)psVar5);
  std::__cxx11::string::~string((string *)&parsedArgs);
  bVar2 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(&platform);
  if (!bVar2) {
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x35;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         anon_var_dwarf_5d0db6;
    archive.Status = (cmExecutionStatus *)platform._M_string_length;
    archive.Linker._M_t.
    super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
    super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>,_true,_true>)
         (__uniq_ptr_data<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>,_true,_true>)
         platform._M_dataplus._M_p;
    cmStrCat<char[2]>(&varName,(cmAlphaNum *)&parsedArgs,(cmAlphaNum *)&archive,
                      (char (*) [2])0x6735bd);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&varName);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar2 = false;
    goto LAB_002186fb;
  }
  this = cmMakefile::GetState(status->Makefile);
  MVar3 = cmState::GetMode(this);
  if (MVar3 == Project) {
    pcVar1 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parsedArgs,
               "You have used file(GET_RUNTIME_DEPENDENCIES) in project mode. This is probably not what you intended to do. Instead, please consider using it in an install(CODE) or install(SCRIPT) command. For example:\n  install(CODE [[\n    file(GET_RUNTIME_DEPENDENCIES\n      # ...\n      )\n    ]])"
               ,(allocator<char> *)&archive);
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&parsedArgs);
    std::__cxx11::string::~string((string *)&parsedArgs);
  }
  if ((anonymous_namespace)::
      HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar4 != 0) {
      parsedArgs.UnresolvedDependenciesVar.field_2._M_allocated_capacity = 0;
      parsedArgs.UnresolvedDependenciesVar.field_2._8_8_ = 0;
      parsedArgs.UnresolvedDependenciesVar._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.UnresolvedDependenciesVar._M_string_length = 0;
      parsedArgs.ResolvedDependenciesVar.field_2._M_allocated_capacity = 0;
      parsedArgs.ResolvedDependenciesVar.field_2._8_8_ = 0;
      parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.ResolvedDependenciesVar._M_string_length = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      name.super_string_view._M_str = "RESOLVED_DEPENDENCIES_VAR";
      name.super_string_view._M_len = 0x19;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name,0x30);
      name_00.super_string_view._M_str = "UNRESOLVED_DEPENDENCIES_VAR";
      name_00.super_string_view._M_len = 0x1b;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_00,0x50);
      name_01.super_string_view._M_str = "CONFLICTING_DEPENDENCIES_PREFIX";
      name_01.super_string_view._M_len = 0x1f;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_01,0x70);
      name_02.super_string_view._M_str = "RPATH_PREFIX";
      name_02.super_string_view._M_len = 0xc;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_02,0x90);
      name_03.super_string_view._M_str = "BUNDLE_EXECUTABLE";
      name_03.super_string_view._M_len = 0x11;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_03,0xb0);
      name_04.super_string_view._M_str = "EXECUTABLES";
      name_04.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_04,0xd0);
      name_05.super_string_view._M_str = "LIBRARIES";
      name_05.super_string_view._M_len = 9;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_05,0xe8);
      name_06.super_string_view._M_str = "MODULES";
      name_06.super_string_view._M_len = 7;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_06,0x118);
      name_07.super_string_view._M_str = "DIRECTORIES";
      name_07.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_07,0x100);
      name_08.super_string_view._M_str = "PRE_INCLUDE_REGEXES";
      name_08.super_string_view._M_len = 0x13;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_08,0x130);
      name_09.super_string_view._M_str = "PRE_EXCLUDE_REGEXES";
      name_09.super_string_view._M_len = 0x13;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_09,0x148);
      name_10.super_string_view._M_str = "POST_INCLUDE_REGEXES";
      name_10.super_string_view._M_len = 0x14;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_10,0x160);
      name_11.super_string_view._M_str = "POST_EXCLUDE_REGEXES";
      name_11.super_string_view._M_len = 0x14;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_11,0x178);
      name_12.super_string_view._M_str = "POST_INCLUDE_FILES";
      name_12.super_string_view._M_len = 0x12;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_12,400);
      name_13.super_string_view._M_str = "POST_EXCLUDE_FILES";
      name_13.super_string_view._M_len = 0x12;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_13,0x1a8);
      name_14.super_string_view._M_str = "POST_EXCLUDE_FILES_STRICT";
      name_14.super_string_view._M_len = 0x19;
      cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((cmArgumentParser<(anonymous_namespace)::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_14,0x1c0);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleGetRuntimeDependenciesCommand::parser,(ActionMap *)&parsedArgs)
      ;
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parsedArgs);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleGetRuntimeDependenciesCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  varName._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.ResolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.ResolvedDependenciesVar.field_2;
  parsedArgs.ResolvedDependenciesVar._M_string_length = 0;
  parsedArgs.ResolvedDependenciesVar.field_2._M_allocated_capacity =
       parsedArgs.ResolvedDependenciesVar.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.UnresolvedDependenciesVar._M_dataplus._M_p =
       (pointer)&parsedArgs.UnresolvedDependenciesVar.field_2;
  parsedArgs.UnresolvedDependenciesVar._M_string_length = 0;
  parsedArgs.UnresolvedDependenciesVar.field_2._M_allocated_capacity =
       parsedArgs.UnresolvedDependenciesVar.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.ConflictingDependenciesPrefix._M_dataplus._M_p =
       (pointer)&parsedArgs.ConflictingDependenciesPrefix.field_2;
  parsedArgs.ConflictingDependenciesPrefix._M_string_length = 0;
  parsedArgs.ConflictingDependenciesPrefix.field_2._M_local_buf[0] = '\0';
  parsedArgs.RPathPrefix._M_dataplus._M_p = (pointer)&parsedArgs.RPathPrefix.field_2;
  parsedArgs.RPathPrefix._M_string_length = 0;
  varName._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.RPathPrefix.field_2._M_local_buf[0] = '\0';
  parsedArgs.BundleExecutable._M_dataplus._M_p = (pointer)&parsedArgs.BundleExecutable.field_2;
  parsedArgs.BundleExecutable._M_string_length = 0;
  parsedArgs.BundleExecutable.field_2._M_local_buf[0] = '\0';
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  memset(&parsedArgs.Executables,0,0x108);
  archive.Status = (cmExecutionStatus *)&HandleGetRuntimeDependenciesCommand::parser;
  archive.GetRuntimeDependenciesTool.field_2._M_allocated_capacity = 0;
  archive.GetRuntimeDependenciesTool.field_2._8_8_ = 0;
  archive.GetRuntimeDependenciesCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  archive.GetRuntimeDependenciesCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  archive.GetRuntimeDependenciesCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  archive.SearchDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  archive.SearchDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  archive.SearchDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  archive.BundleExecutable._M_dataplus._M_p._0_1_ = 0;
  archive.Linker._M_t.
  super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
  super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>,_true,_true>)
       (__uniq_ptr_data<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>,_true,_true>)
       &parsedArgs;
  archive.GetRuntimeDependenciesTool._M_dataplus._M_p = (pointer)&unrecognizedArguments;
  archive.GetRuntimeDependenciesTool._M_string_length = (size_type)&parsedArgs;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&archive,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&varName,0);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &archive.GetRuntimeDependenciesCommand.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar2) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar2 = true;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5d0,
               &parsedArgs.Directories.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      std::__cxx11::string::string((string *)&local_558,(string *)&parsedArgs.BundleExecutable);
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           parsedArgs.PostIncludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           parsedArgs.PostIncludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_578.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           parsedArgs.PostIncludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      parsedArgs.PostIncludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parsedArgs.PostIncludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parsedArgs.PostIncludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           parsedArgs.PostExcludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           parsedArgs.PostExcludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           parsedArgs.PostExcludeFiles.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      parsedArgs.PostExcludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parsedArgs.PostExcludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parsedArgs.PostExcludeFiles.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           parsedArgs.PostExcludeFilesStrict.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           parsedArgs.PostExcludeFilesStrict.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           parsedArgs.PostExcludeFilesStrict.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      parsedArgs.PostExcludeFilesStrict.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parsedArgs.PostExcludeFilesStrict.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parsedArgs.PostExcludeFilesStrict.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmRuntimeDependencyArchive::cmRuntimeDependencyArchive
                (&archive,status,&local_5d0,&local_558,
                 &parsedArgs.PreIncludeRegexes.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,&parsedArgs.PreExcludeRegexes.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,&parsedArgs.PostIncludeRegexes.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,&parsedArgs.PostExcludeRegexes.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,&local_578,&local_598,&local_5b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_598);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_578);
      std::__cxx11::string::~string((string *)&local_558);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5d0);
      bVar2 = cmRuntimeDependencyArchive::Prepare(&archive);
      if (bVar2) {
        bVar2 = cmRuntimeDependencyArchive::GetRuntimeDependencies
                          (&archive,&parsedArgs.Executables.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,&parsedArgs.Libraries.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,&parsedArgs.Modules.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          );
        if (!bVar2) goto LAB_0021839b;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        unresolvedDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        unresolvedDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        unresolvedDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        conflictingDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        conflictingDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        conflictingDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pmVar6 = cmRuntimeDependencyArchive::GetResolvedPaths_abi_cxx11_(&archive);
        for (p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          p_Var7 = p_Var8[2]._M_right;
          __last = &p_Var8[2]._M_parent;
          if (p_Var7 == (_Base_ptr)__last) {
            __assert_fail("it != val.second.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileCommand.cxx"
                          ,0xc31,
                          "bool (anonymous namespace)::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                         );
          }
          __x = p_Var8 + 1;
          __x_00 = p_Var7 + 1;
          do {
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            if (p_Var7 == (_Base_ptr)__last) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&deps,(value_type *)__x_00);
              if (parsedArgs.RPathPrefix._M_string_length != 0) {
                pcVar1 = status->Makefile;
                std::operator+(&pathsStr,&parsedArgs.RPathPrefix,"_");
                std::operator+(&varName,&pathsStr,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __x_00);
                this_00 = cmRuntimeDependencyArchive::GetRPaths_abi_cxx11_(&archive);
                rng = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::at(this_00,(key_type *)__x_00);
                separator_00._M_str = ";";
                separator_00._M_len = 1;
                cmJoin((string *)&paths,rng,separator_00,(string_view)ZEXT816(0));
                value_00._M_str =
                     (char *)paths.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                value_00._M_len =
                     (size_t)paths.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                cmMakefile::AddDefinition(pcVar1,&varName,value_00);
                std::__cxx11::string::~string((string *)&paths);
                std::__cxx11::string::~string((string *)&varName);
                std::__cxx11::string::~string((string *)&pathsStr);
              }
              goto LAB_00218383;
            }
            bVar2 = cmsys::SystemTools::SameFile((string *)__x_00,(string *)(p_Var7 + 1));
          } while (bVar2);
          if (parsedArgs.ConflictingDependenciesPrefix._M_string_length == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&varName);
            poVar10 = std::operator<<((ostream *)&varName,"Multiple conflicting paths found for ");
            poVar10 = std::operator<<(poVar10,(string *)__x);
            std::operator<<(poVar10,":");
            for (p_Var8 = p_Var8[2]._M_right; p_Var8 != (_Base_ptr)__last;
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
              poVar10 = std::operator<<((ostream *)&varName,"\n  ");
              std::operator<<(poVar10,(string *)(p_Var8 + 1));
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00218690;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&conflictingDeps,(value_type *)__x);
          paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
                     (const_iterator)0x0,p_Var8[2]._M_right,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )__last);
          std::operator+(&pathsStr,&parsedArgs.ConflictingDependenciesPrefix,"_");
          std::operator+(&varName,&pathsStr,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
          std::__cxx11::string::~string((string *)&pathsStr);
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin(&pathsStr,&paths,separator,(string_view)ZEXT816(0));
          value._M_str = pathsStr._M_dataplus._M_p;
          value._M_len = pathsStr._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,&varName,value);
          std::__cxx11::string::~string((string *)&pathsStr);
          std::__cxx11::string::~string((string *)&varName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&paths);
LAB_00218383:
        }
        psVar9 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
        __position = unresolvedDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if ((psVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00218409:
          if (parsedArgs.ResolvedDependenciesVar._M_string_length != 0) {
            separator_01._M_str = ";";
            separator_01._M_len = 1;
            cmJoin(&varName,&deps,separator_01,(string_view)ZEXT816(0));
            value_01._M_str = varName._M_dataplus._M_p;
            value_01._M_len = varName._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,&parsedArgs.ResolvedDependenciesVar,value_01)
            ;
            std::__cxx11::string::~string((string *)&varName);
          }
          if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin(&varName,&unresolvedDeps,separator_02,(string_view)ZEXT816(0));
            value_02._M_str = varName._M_dataplus._M_p;
            value_02._M_len = varName._M_string_length;
            cmMakefile::AddDefinition
                      (status->Makefile,&parsedArgs.UnresolvedDependenciesVar,value_02);
            std::__cxx11::string::~string((string *)&varName);
          }
          bVar2 = true;
          if (parsedArgs.ConflictingDependenciesPrefix._M_string_length != 0) {
            separator_03._M_str = ";";
            separator_03._M_len = 1;
            cmJoin(&varName,&conflictingDeps,separator_03,(string_view)ZEXT816(0));
            pcVar1 = status->Makefile;
            std::operator+(&pathsStr,&parsedArgs.ConflictingDependenciesPrefix,"_FILENAMES");
            value_03._M_str = varName._M_dataplus._M_p;
            value_03._M_len = varName._M_string_length;
            cmMakefile::AddDefinition(pcVar1,&pathsStr,value_03);
            std::__cxx11::string::~string((string *)&pathsStr);
            std::__cxx11::string::~string((string *)&varName);
          }
        }
        else {
          if (parsedArgs.UnresolvedDependenciesVar._M_string_length != 0) {
            psVar9 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
            __first._M_node = (psVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            psVar9 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &unresolvedDeps,(const_iterator)__position,__first,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(psVar9->_M_t)._M_impl.super__Rb_tree_header);
            goto LAB_00218409;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&varName);
          std::operator<<((ostream *)&varName,"Could not resolve runtime dependencies:");
          psVar9 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_(&archive);
          for (p_Var8 = (psVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &(psVar9->_M_t)._M_impl.super__Rb_tree_header;
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
            poVar10 = std::operator<<((ostream *)&varName,"\n  ");
            std::operator<<(poVar10,(string *)(p_Var8 + 1));
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00218690:
          std::__cxx11::string::~string((string *)&pathsStr);
          cmSystemTools::s_FatalErrorOccurred = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&varName);
          bVar2 = false;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&conflictingDeps);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&unresolvedDeps);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&deps);
      }
      else {
LAB_0021839b:
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar2 = false;
      }
      cmRuntimeDependencyArchive::~cmRuntimeDependencyArchive(&archive);
    }
  }
  else {
    archive.Status = (cmExecutionStatus *)&DAT_00000018;
    archive.Linker._M_t.
    super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
    super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>,_true,_true>)
         ((long)"CONFIGURE Unrecognized argument: \"" + 10);
    varName._M_string_length =
         (size_type)
         ((unrecognizedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    varName._M_dataplus._M_p =
         (pointer)(unrecognizedArguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[2]>(&pathsStr,(cmAlphaNum *)&archive,(cmAlphaNum *)&varName,(char (*) [2])0x6735bd
                     );
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&pathsStr);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar2 = false;
  }
  HandleGetRuntimeDependenciesCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
LAB_002186fb:
  std::__cxx11::string::~string((string *)&platform);
  return bVar2;
}

Assistant:

bool HandleGetRuntimeDependenciesCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::string platform =
    status.GetMakefile().GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
        platform)) {
    status.SetError(
      cmStrCat("GET_RUNTIME_DEPENDENCIES is not supported on system \"",
               platform, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (status.GetMakefile().GetState()->GetMode() == cmState::Project) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "You have used file(GET_RUNTIME_DEPENDENCIES)"
      " in project mode. This is probably not what "
      "you intended to do. Instead, please consider"
      " using it in an install(CODE) or "
      "install(SCRIPT) command. For example:"
      "\n  install(CODE [["
      "\n    file(GET_RUNTIME_DEPENDENCIES"
      "\n      # ..."
      "\n      )"
      "\n    ]])");
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string ResolvedDependenciesVar;
    std::string UnresolvedDependenciesVar;
    std::string ConflictingDependenciesPrefix;
    std::string RPathPrefix;
    std::string BundleExecutable;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Executables;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Libraries;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Directories;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Modules;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PreIncludeRegexes;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PreExcludeRegexes;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PostIncludeRegexes;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PostExcludeRegexes;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PostIncludeFiles;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> PostExcludeFiles;
    ArgumentParser::MaybeEmpty<std::vector<std::string>>
      PostExcludeFilesStrict;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESOLVED_DEPENDENCIES_VAR"_s, &Arguments::ResolvedDependenciesVar)
      .Bind("UNRESOLVED_DEPENDENCIES_VAR"_s,
            &Arguments::UnresolvedDependenciesVar)
      .Bind("CONFLICTING_DEPENDENCIES_PREFIX"_s,
            &Arguments::ConflictingDependenciesPrefix)
      .Bind("RPATH_PREFIX"_s, &Arguments::RPathPrefix)
      .Bind("BUNDLE_EXECUTABLE"_s, &Arguments::BundleExecutable)
      .Bind("EXECUTABLES"_s, &Arguments::Executables)
      .Bind("LIBRARIES"_s, &Arguments::Libraries)
      .Bind("MODULES"_s, &Arguments::Modules)
      .Bind("DIRECTORIES"_s, &Arguments::Directories)
      .Bind("PRE_INCLUDE_REGEXES"_s, &Arguments::PreIncludeRegexes)
      .Bind("PRE_EXCLUDE_REGEXES"_s, &Arguments::PreExcludeRegexes)
      .Bind("POST_INCLUDE_REGEXES"_s, &Arguments::PostIncludeRegexes)
      .Bind("POST_EXCLUDE_REGEXES"_s, &Arguments::PostExcludeRegexes)
      .Bind("POST_INCLUDE_FILES"_s, &Arguments::PostIncludeFiles)
      .Bind("POST_EXCLUDE_FILES"_s, &Arguments::PostExcludeFiles)
      .Bind("POST_EXCLUDE_FILES_STRICT"_s, &Arguments::PostExcludeFilesStrict);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  cmRuntimeDependencyArchive archive(
    status, parsedArgs.Directories, parsedArgs.BundleExecutable,
    parsedArgs.PreIncludeRegexes, parsedArgs.PreExcludeRegexes,
    parsedArgs.PostIncludeRegexes, parsedArgs.PostExcludeRegexes,
    std::move(parsedArgs.PostIncludeFiles),
    std::move(parsedArgs.PostExcludeFiles),
    std::move(parsedArgs.PostExcludeFilesStrict));
  if (!archive.Prepare()) {
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!archive.GetRuntimeDependencies(
        parsedArgs.Executables, parsedArgs.Libraries, parsedArgs.Modules)) {
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  std::vector<std::string> deps;
  std::vector<std::string> unresolvedDeps;
  std::vector<std::string> conflictingDeps;
  for (auto const& val : archive.GetResolvedPaths()) {
    bool unique = true;
    auto it = val.second.begin();
    assert(it != val.second.end());
    auto const& firstPath = *it;
    while (++it != val.second.end()) {
      if (!cmSystemTools::SameFile(firstPath, *it)) {
        unique = false;
        break;
      }
    }

    if (unique) {
      deps.push_back(firstPath);
      if (!parsedArgs.RPathPrefix.empty()) {
        status.GetMakefile().AddDefinition(
          parsedArgs.RPathPrefix + "_" + firstPath,
          cmJoin(archive.GetRPaths().at(firstPath), ";"));
      }
    } else if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
      conflictingDeps.push_back(val.first);
      std::vector<std::string> paths;
      paths.insert(paths.begin(), val.second.begin(), val.second.end());
      std::string varName =
        parsedArgs.ConflictingDependenciesPrefix + "_" + val.first;
      std::string pathsStr = cmJoin(paths, ";");
      status.GetMakefile().AddDefinition(varName, pathsStr);
    } else {
      std::ostringstream e;
      e << "Multiple conflicting paths found for " << val.first << ":";
      for (auto const& path : val.second) {
        e << "\n  " << path;
      }
      status.SetError(e.str());
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }
  if (!archive.GetUnresolvedPaths().empty()) {
    if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
      unresolvedDeps.insert(unresolvedDeps.begin(),
                            archive.GetUnresolvedPaths().begin(),
                            archive.GetUnresolvedPaths().end());
    } else {
      std::ostringstream e;
      e << "Could not resolve runtime dependencies:";
      for (auto const& path : archive.GetUnresolvedPaths()) {
        e << "\n  " << path;
      }
      status.SetError(e.str());
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (!parsedArgs.ResolvedDependenciesVar.empty()) {
    std::string val = cmJoin(deps, ";");
    status.GetMakefile().AddDefinition(parsedArgs.ResolvedDependenciesVar,
                                       val);
  }
  if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
    std::string val = cmJoin(unresolvedDeps, ";");
    status.GetMakefile().AddDefinition(parsedArgs.UnresolvedDependenciesVar,
                                       val);
  }
  if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
    std::string val = cmJoin(conflictingDeps, ";");
    status.GetMakefile().AddDefinition(
      parsedArgs.ConflictingDependenciesPrefix + "_FILENAMES", val);
  }
  return true;
}